

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reap.c
# Opt level: O2

_Bool nni_reap_sys_drain(void)

{
  _Bool _Var1;
  
  nni_mtx_lock(&reap_mtx);
  _Var1 = false;
  while (reap_empty == '\0') {
    nni_cv_wait(&reap_empty_cv);
    _Var1 = true;
  }
  nni_mtx_unlock(&reap_mtx);
  return _Var1;
}

Assistant:

bool
nni_reap_sys_drain(void)
{
	bool result = false;
	nni_mtx_lock(&reap_mtx);
	while (!reap_empty) {
		result = true;
		nni_cv_wait(&reap_empty_cv);
	}
	nni_mtx_unlock(&reap_mtx);
	return (result);
}